

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_parse_tests.cpp
# Opt level: O1

void __thiscall script_parse_tests::parse_script::test_method(parse_script *this)

{
  undefined8 uVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint uVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *psVar9;
  pointer ppVar10;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar11;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  lazy_ostream local_7c8;
  undefined1 *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  IN_OUT;
  string *local_770;
  string *local_768;
  char *local_760;
  char *local_758;
  assertion_result local_750;
  direct_or_indirect local_738;
  uint local_71c;
  direct_or_indirect local_718;
  uint local_6fc;
  direct_or_indirect local_6f8;
  uint local_6dc;
  direct_or_indirect local_6d8;
  uint local_6bc;
  string local_6b8;
  string all_out;
  string all_in;
  undefined1 local_658 [16];
  undefined1 local_648 [48];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_558;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[1],_const_char_(&)[1],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_658,(char (*) [1])0xf6cf21,(char (*) [1])0xf6cf21);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_618,(char (*) [2])0xfbe1bd,(char (*) [3])0xe6e818);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_5d8,(char (*) [2])0xf6d961,(char (*) [3])0xea009c);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_598,(char (*) [2])0xe68ecc,(char (*) [3])0xeb6aaa);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_558,(char (*) [2])0xe62a68,(char (*) [3])0xf3fa40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_518,(char (*) [2])0xeba178,(char (*) [3])0xeb6a7a);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_4d8,(char (*) [2])0xea1293,(char (*) [3])0xe5e8c0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_498,(char (*) [2])0x1111aeb,(char (*) [3])0xf88f66);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_458,(char (*) [2])0x1124ebb,(char (*) [3])0xe6f35c);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_418,(char (*) [2])0x113831d,(char (*) [3])0xe70973);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_3d8,(char (*) [2])0xe6e6ab,(char (*) [3])0xe5401c);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_398,(char (*) [3])0xe989e6,(char (*) [3])0xf092fe);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_358,(char (*) [3])0xe9ecda,(char (*) [3])0xe6ff69);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_318,(char (*) [3])0xf705de,(char (*) [3])0xe93167);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_2d8,(char (*) [3])0xeb6dba,(char (*) [3])"5d");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_298,(char (*) [3])0xeb6d8e,(char (*) [3])"5e");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_258,(char (*) [3])0xeb6d62,(char (*) [3])0xe860a1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_218,(char (*) [3])0x1122f06,(char (*) [3])0x111317f);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_1d8,(char (*) [3])0xeb6d0a,(char (*) [5])"0111");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_198,(char (*) [3])0xec1bf8,(char (*) [5])"0189");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            (&local_158,(char (*) [5])"0x17",(char (*) [3])0xeb6d0a);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[7],_true>
            (&local_118,(char (*) [5])"\'17\'",(char (*) [7])"023137");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            (&local_d8,(char (*) [5])0xf8ab0b,(char (*) [3])0xe74818);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[3],_true>
            (&local_98,(char (*) [6])0xf8ae25,(char (*) [3])0xe61da5);
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_658;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&IN_OUT,__l,(allocator_type *)local_58);
  lVar5 = -0x600;
  paVar8 = &local_98.second.field_2;
  do {
    if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar8->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],paVar8->_M_allocated_capacity + 1
                     );
    }
    if (&paVar8->_M_allocated_capacity + -4 != (size_type *)(&paVar8->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar8->_M_allocated_capacity)[-6],
                      (&paVar8->_M_allocated_capacity)[-4] + 1);
    }
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar8->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  all_in._M_dataplus._M_p = (pointer)&all_in.field_2;
  all_in._M_string_length = 0;
  all_in.field_2._M_local_buf[0] = '\0';
  all_out._M_dataplus._M_p = (pointer)&all_out.field_2;
  all_out._M_string_length = 0;
  all_out.field_2._M_local_buf[0] = '\0';
  if (IN_OUT.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      IN_OUT.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar9 = &(IN_OUT.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    do {
      local_798 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
      ;
      local_790 = "";
      local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x2d;
      file.m_begin = (iterator)&local_798;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7a8,msg)
      ;
      local_7c8.m_empty = false;
      local_7c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
      local_7b8 = boost::unit_test::lazy_ostream::inst;
      local_7b0 = "";
      ::ParseScript((CScript *)&local_6d8.indirect_contents,psVar9 + -1);
      uVar4 = local_6bc - 0x1d;
      uVar1 = local_6d8.indirect_contents.indirect;
      if (local_6bc < 0x1d) {
        uVar4 = local_6bc;
        uVar1 = &local_6d8;
      }
      s.m_size._0_4_ = uVar4;
      s.m_data = (uchar *)uVar1;
      s.m_size._4_4_ = 0;
      HexStr_abi_cxx11_(&local_6b8,s);
      if (local_6b8._M_string_length == psVar9->_M_string_length) {
        if (local_6b8._M_string_length == 0) {
          local_750.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x1;
        }
        else {
          iVar2 = bcmp(local_6b8._M_dataplus._M_p,(psVar9->_M_dataplus)._M_p,
                       local_6b8._M_string_length);
          local_750.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar2 == 0);
        }
      }
      else {
        local_750.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
      }
      local_750.m_message.px = (element_type *)0x0;
      local_750.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_760 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
      ;
      local_758 = "";
      local_768 = &local_6b8;
      local_658._8_8_ = local_658._8_8_ & 0xffffffffffffff00;
      local_658._0_8_ = &PTR__lazy_ostream_013abbf0;
      local_648._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_648._8_8_ = &local_768;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
      aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_48._8_8_ = &local_770;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      local_770 = psVar9;
      boost::test_tools::tt_detail::report_assertion
                (&local_750,&local_7c8,1,2,REQUIRE,0xec5d5a,(size_t)&local_760,0x2d,local_658,"out",
                 local_58);
      boost::detail::shared_count::~shared_count(&local_750.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      if (0x1c < local_6bc) {
        free(local_6d8.indirect_contents.indirect);
        local_6d8.indirect_contents.indirect = (char *)0x0;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     " ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar9 + -1));
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      " ");
      local_658._0_8_ = (pbVar3->_M_dataplus)._M_p;
      paVar8 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658._0_8_ == paVar8) {
        local_648._0_8_ = paVar8->_M_allocated_capacity;
        local_648._8_8_ = *(long *)((long)&pbVar3->field_2 + 8);
        local_658._0_8_ = local_648;
      }
      else {
        local_648._0_8_ = paVar8->_M_allocated_capacity;
      }
      local_658._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&all_in,(char *)local_658._0_8_,local_658._8_8_);
      if ((undefined1 *)local_658._0_8_ != local_648) {
        operator_delete((void *)local_658._0_8_,local_648._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&all_out,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
      ppVar10 = (pointer)(psVar9 + 1);
      psVar9 = psVar9 + 2;
    } while (ppVar10 !=
             IN_OUT.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x31;
  file_00.m_begin = (iterator)&local_7d8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7e8,
             msg_00);
  local_7c8.m_empty = false;
  local_7c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_7b8 = boost::unit_test::lazy_ostream::inst;
  local_7b0 = "";
  ::ParseScript((CScript *)&local_6d8.indirect_contents,&all_in);
  uVar4 = local_6bc - 0x1d;
  uVar1 = local_6d8.indirect_contents.indirect;
  if (local_6bc < 0x1d) {
    uVar4 = local_6bc;
    uVar1 = &local_6d8;
  }
  s_00.m_size._0_4_ = uVar4;
  s_00.m_data = (uchar *)uVar1;
  s_00.m_size._4_4_ = 0;
  HexStr_abi_cxx11_(&local_6b8,s_00);
  if (local_6b8._M_string_length == all_out._M_string_length) {
    if (local_6b8._M_string_length == 0) {
      local_750.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(local_6b8._M_dataplus._M_p,all_out._M_dataplus._M_p,local_6b8._M_string_length);
      local_750.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_750.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_750.m_message.px = (element_type *)0x0;
  local_750.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_758 = "";
  local_648._8_8_ = &local_768;
  local_658._8_8_ = local_658._8_8_ & 0xffffffffffffff00;
  local_658._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_648._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_770 = &all_out;
  aStack_48._8_8_ = &local_770;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_768 = &local_6b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_750,&local_7c8,1,2,REQUIRE,0xec5d72,(size_t)&local_760,0x31,local_658,"all_out",
             local_58);
  boost::detail::shared_count::~shared_count(&local_750.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if (0x1c < local_6bc) {
    free(local_6d8.indirect_contents.indirect);
    local_6d8.indirect_contents.indirect = (char *)0x0;
  }
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x33;
  file_01.m_begin = (iterator)&local_7f8;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_808,
             msg_01);
  local_658._0_8_ = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"11111111111111111111","");
  ::ParseScript((CScript *)&local_6f8.indirect_contents,(string *)local_658);
  if (0x1c < local_6dc) {
    free(local_6f8.indirect_contents.indirect);
    local_6f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((undefined1 *)local_658._0_8_ != local_648) {
    operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
  }
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x5acd12;
  file_02.m_end = (iterator)0x33;
  file_02.m_begin = (iterator)&local_818;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_828,
             msg_02);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_658._8_8_ = local_658._8_8_ & 0xffffffffffffff00;
  local_658._0_8_ = &PTR__lazy_ostream_013ac470;
  local_648._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = "exception std::runtime_error expected but not raised";
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_830 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_658,1,1,WARN,_cVar11,
             (size_t)&local_838,0x33);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x34;
  file_03.m_begin = (iterator)&local_878;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_888,
             msg_03);
  local_658._0_8_ = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"11111111111","");
  ::ParseScript((CScript *)&local_718.indirect_contents,(string *)local_658);
  if (0x1c < local_6fc) {
    free(local_718.indirect_contents.indirect);
    local_718.indirect_contents.indirect = (char *)0x0;
  }
  if ((undefined1 *)local_658._0_8_ != local_648) {
    operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
  }
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_890 = "";
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x5ace61;
  file_04.m_end = (iterator)0x34;
  file_04.m_begin = (iterator)&local_898;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8a8,
             msg_04);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_658._8_8_ = local_658._8_8_ & 0xffffffffffffff00;
  local_658._0_8_ = &PTR__lazy_ostream_013ac470;
  local_648._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = "exception std::runtime_error expected but not raised";
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_8b0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_658,1,1,WARN,_cVar11,
             (size_t)&local_8b8,0x34);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x35;
  file_05.m_begin = (iterator)&local_8f8;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_908,
             msg_05);
  local_658._0_8_ = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"OP_CHECKSIGADD","");
  ::ParseScript((CScript *)&local_738.indirect_contents,(string *)local_658);
  if (0x1c < local_71c) {
    free(local_738.indirect_contents.indirect);
    local_738.indirect_contents.indirect = (char *)0x0;
  }
  if ((undefined1 *)local_658._0_8_ != local_648) {
    operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
  }
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x5acfa7;
  file_06.m_end = (iterator)0x35;
  file_06.m_begin = (iterator)&local_918;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_928,
             msg_06);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_658._8_8_ = local_658._8_8_ & 0xffffffffffffff00;
  local_658._0_8_ = &PTR__lazy_ostream_013ac470;
  local_648._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = "exception std::runtime_error expected but not raised";
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_930 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_658,1,1,WARN,_cVar11,
             (size_t)&local_938,0x35);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)all_out._M_dataplus._M_p != &all_out.field_2) {
    operator_delete(all_out._M_dataplus._M_p,
                    CONCAT71(all_out.field_2._M_allocated_capacity._1_7_,
                             all_out.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)all_in._M_dataplus._M_p != &all_in.field_2) {
    operator_delete(all_in._M_dataplus._M_p,
                    CONCAT71(all_in.field_2._M_allocated_capacity._1_7_,
                             all_in.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&IN_OUT);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_script)
{
    const std::vector<std::pair<std::string,std::string>> IN_OUT{
        // {IN: script string , OUT: hex string }
        {"", ""},
        {"0", "00"},
        {"1", "51"},
        {"2", "52"},
        {"3", "53"},
        {"4", "54"},
        {"5", "55"},
        {"6", "56"},
        {"7", "57"},
        {"8", "58"},
        {"9", "59"},
        {"10", "5a"},
        {"11", "5b"},
        {"12", "5c"},
        {"13", "5d"},
        {"14", "5e"},
        {"15", "5f"},
        {"16", "60"},
        {"17", "0111"},
        {"-9", "0189"},
        {"0x17", "17"},
        {"'17'", "023137"},
        {"ELSE", "67"},
        {"NOP10", "b9"},
    };
    std::string all_in;
    std::string all_out;
    for (const auto& [in, out] : IN_OUT) {
        BOOST_CHECK_EQUAL(HexStr(ParseScript(in)), out);
        all_in += " " + in + " ";
        all_out += out;
    }
    BOOST_CHECK_EQUAL(HexStr(ParseScript(all_in)), all_out);

    BOOST_CHECK_EXCEPTION(ParseScript("11111111111111111111"), std::runtime_error, HasReason("script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"));
    BOOST_CHECK_EXCEPTION(ParseScript("11111111111"), std::runtime_error, HasReason("script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"));
    BOOST_CHECK_EXCEPTION(ParseScript("OP_CHECKSIGADD"), std::runtime_error, HasReason("script parse error: unknown opcode"));
}